

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int __thiscall asl::String::Enumerator::operator*(Enumerator *this)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char c4;
  char c3_1;
  char c2_2;
  char c3;
  char c2_1;
  char c2;
  char c;
  Enumerator *this_local;
  
  cVar1 = *this->u;
  if (((int)cVar1 & 0x80U) == 0) {
    this->n = 1;
    this_local._4_4_ = (uint)cVar1;
  }
  else if (((int)cVar1 & 0xe0U) == 0xc0) {
    cVar2 = this->u[1];
    if (cVar2 == '\0') {
      this->n = 1;
      this_local._4_4_ = 0;
    }
    else {
      this->n = 2;
      this_local._4_4_ = ((int)cVar1 & 0x1fU) << 6 | (int)cVar2 & 0x3fU;
    }
  }
  else if (((int)cVar1 & 0xf0U) == 0xe0) {
    cVar2 = this->u[1];
    if (cVar2 == '\0') {
      this->n = 1;
      this_local._4_4_ = 0;
    }
    else {
      cVar3 = this->u[2];
      if (cVar3 == '\0') {
        this->n = 2;
        this_local._4_4_ = 0;
      }
      else {
        this->n = 3;
        this_local._4_4_ =
             ((int)cVar1 & 0xfU) << 0xc | ((int)cVar2 & 0x3fU) << 6 | (int)cVar3 & 0x3fU;
      }
    }
  }
  else {
    this->n = 4;
    if (this->u[1] == '\0') {
      this->n = 1;
      this_local._4_4_ = 0;
    }
    else if (this->u[2] == '\0') {
      this->n = 2;
      this_local._4_4_ = 0;
    }
    else if (this->u[3] == '\0') {
      this->n = 3;
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ =
           ((int)cVar1 & 7U) << 0x12 | ((int)this->u[1] & 0x3fU) << 0xc |
           ((int)this->u[2] & 0x3fU) << 6 | (int)this->u[3] & 0x3fU;
    }
  }
  return this_local._4_4_;
}

Assistant:

int String::Enumerator::operator*()
{
#ifdef ASL_ANSI
	n = 1;
	return (int)(byte)u[0];
#else
	char c = u[0];
	if((c & 0x80) == 0) {
		n = 1;
		return c;
	}
	else if ((c & 0xe0) == 0xc0) {
		char c2 = u[1];
		if (c2 == 0) { n = 1; return 0; }
		n = 2;
		return ((c & 0x1f) << 6) | (c2 & 0x3f);
	}
	else if ((c & 0xf0) == 0xe0) {
		char c2 = u[1];
		if (c2 == 0) { n = 1; return 0; }
		char c3 = u[2];
		if (c3 == 0) { n = 2; return 0; }
		n = 3;
		return ((c & 0x0f) << 12) | ((c2 & 0x3f) << 6) | (c3 & 0x3f);
	}
	else {
		n = 4;
		char c2 = u[1];
		if (c2 == 0) { n = 1; return 0; }
		char c3 = u[2];
		if (c3 == 0) { n = 2; return 0; }
		char c4 = u[3];
		if (c4 == 0) { n = 3; return 0; }
		return ((c & 0x07) << 18) | ((c2 & 0x3f) << 12) | ((c3 & 0x3f) << 6) | (c4 & 0x3f);
	}
#endif
}